

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O2

Value * soul::generateWaveform(Value *__return_storage_ptr__,Annotation *annotation)

{
  bool bVar1;
  int64_t iVar2;
  string *this;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  double local_b0;
  double local_a8;
  Triangle g_2;
  string local_80;
  string local_60;
  Sine g;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&g_2,"sinewave",(allocator<char> *)&local_60);
  bVar1 = Annotation::getBool(annotation,(string *)&g_2,false);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&g_2);
LAB_00203426:
    g.super_Generator.phaseIncrement = 0.0;
    g.super_Generator.currentPhase = 0.0;
    g.super_Generator._vptr_Generator = (_func_int **)&PTR__Generator_00333b28;
    std::__cxx11::string::string<std::allocator<char>>((string *)&g_2,"frequency",&local_b1);
    local_a8 = Annotation::getDouble(annotation,(string *)&g_2,0.0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rate",&local_b2);
    local_b0 = Annotation::getDouble(annotation,&local_80,0.0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"numFrames",&local_b3);
    iVar2 = Annotation::getInt64(annotation,&local_60,0);
    generateWaveform(__return_storage_ptr__,local_a8,local_b0,iVar2,&g.super_Generator,1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"sine",(allocator<char> *)&g);
    bVar1 = Annotation::getBool(annotation,&local_80,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&g_2);
    if (bVar1) goto LAB_00203426;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&g_2,"sawtooth",(allocator<char> *)&local_60);
    bVar1 = Annotation::getBool(annotation,(string *)&g_2,false);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&g_2);
LAB_00203582:
      g.super_Generator.phaseIncrement = 0.0;
      g.super_Generator.currentPhase = 0.0;
      g.super_Generator._vptr_Generator = (_func_int **)&PTR__Generator_00333b78;
      std::__cxx11::string::string<std::allocator<char>>((string *)&g_2,"frequency",&local_b1);
      local_a8 = Annotation::getDouble(annotation,(string *)&g_2,0.0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rate",&local_b2);
      local_b0 = Annotation::getDouble(annotation,&local_80,0.0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"numFrames",&local_b3);
      iVar2 = Annotation::getInt64(annotation,&local_60,0);
      generateWaveform(__return_storage_ptr__,local_a8,local_b0,iVar2,&g.super_Generator,2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"saw",(allocator<char> *)&g);
      bVar1 = Annotation::getBool(annotation,&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&g_2);
      if (bVar1) goto LAB_00203582;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g_2,"triangle",(allocator<char> *)&local_80);
      bVar1 = Annotation::getBool(annotation,(string *)&g_2,false);
      std::__cxx11::string::~string((string *)&g_2);
      if (bVar1) {
        g_2.super_Square.super_Blep.super_Generator.phaseIncrement = 0.0;
        g_2.super_Square.super_Blep.super_Generator.currentPhase = 0.0;
        g_2.super_Square.super_Blep.super_Generator._vptr_Generator =
             (_func_int **)&PTR__Generator_00333bd0;
        g_2.sum = 1.0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"frequency",&local_b1);
        local_a8 = Annotation::getDouble(annotation,&local_80,0.0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"rate",&local_b2);
        local_b0 = Annotation::getDouble(annotation,&local_60,0.0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&g,"numFrames",&local_b3);
        iVar2 = Annotation::getInt64(annotation,(string *)&g,0);
        generateWaveform(__return_storage_ptr__,local_a8,local_b0,iVar2,(Generator *)&g_2,2);
        std::__cxx11::string::~string((string *)&g);
        std::__cxx11::string::~string((string *)&local_60);
        this = &local_80;
        goto LAB_002034f3;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g_2,"squarewave",(allocator<char> *)&local_60);
      bVar1 = Annotation::getBool(annotation,(string *)&g_2,false);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&g_2);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"square",(allocator<char> *)&g);
        bVar1 = Annotation::getBool(annotation,&local_80,false);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&g_2);
        if (!bVar1) {
          (__return_storage_ptr__->packedData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->packedData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->packedData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
               (_func_int **)&PTR__SimpleStringDictionary_0032d4d0;
          (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
          (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
          (__return_storage_ptr__->value).data = (uint8_t *)0x0;
          (__return_storage_ptr__->dictionary).strings.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x0;
          (__return_storage_ptr__->dictionary).strings.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = (pointer)0x0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->dictionary).strings.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish + 1) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->dictionary).strings.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage + 1) = 0;
          (__return_storage_ptr__->value).stringDictionary =
               &(__return_storage_ptr__->dictionary).super_StringDictionary;
          return __return_storage_ptr__;
        }
      }
      g.super_Generator.phaseIncrement = 0.0;
      g.super_Generator.currentPhase = 0.0;
      g.super_Generator._vptr_Generator = (_func_int **)&PTR__Generator_00333c28;
      std::__cxx11::string::string<std::allocator<char>>((string *)&g_2,"frequency",&local_b1);
      local_a8 = Annotation::getDouble(annotation,(string *)&g_2,0.0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rate",&local_b2);
      local_b0 = Annotation::getDouble(annotation,&local_80,0.0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"numFrames",&local_b3);
      iVar2 = Annotation::getInt64(annotation,&local_60,0);
      generateWaveform(__return_storage_ptr__,local_a8,local_b0,iVar2,&g.super_Generator,2);
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  this = (string *)&g_2;
LAB_002034f3:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (const Annotation& annotation)
{
    if (annotation.getBool ("sinewave") || annotation.getBool ("sine"))
        return generateWaveform<WaveGenerators::Sine> (annotation, 1);

    if (annotation.getBool ("sawtooth") || annotation.getBool ("saw"))
        return generateWaveform<WaveGenerators::Saw> (annotation, 2);

    if (annotation.getBool ("triangle"))
        return generateWaveform<WaveGenerators::Triangle> (annotation, 2);

    if (annotation.getBool ("squarewave") || annotation.getBool ("square"))
        return generateWaveform<WaveGenerators::Square> (annotation, 2);

    return {};
}